

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double cardioid_sample(double a,double b,int *seed)

{
  double dVar1;
  
  dVar1 = r8_uniform_01(seed);
  dVar1 = cardioid_cdf_inv(dVar1,a,b);
  return dVar1;
}

Assistant:

double cardioid_sample ( double a, double b, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    CARDIOID_SAMPLE samples the Cardioid PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 July 2005
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 <= B <= 0.5.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double CARDIOD_SAMPLE, a sample of the PDF.
//    A - PI <= X <= A + PI.
//
{
  double cdf;
  double x;

  cdf = r8_uniform_01 ( seed );

  x = cardioid_cdf_inv ( cdf, a, b );

  return x;
}